

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O3

int __thiscall
soplex::
SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minDelta(SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *param_1,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *val,int num,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upd,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *low,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *up)

{
  fpclass_type fVar1;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  int32_t iVar2;
  Real a;
  int iVar3;
  fpclass_type fVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int32_t *piVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  uint *puVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  uint *puVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  byte bVar16;
  int32_t iVar17;
  uint uVar18;
  long in_FS_OFFSET;
  byte bVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  cpp_dec_float<200U,_int,_void> local_3e8;
  cpp_dec_float<200U,_int,_void> local_368;
  cpp_dec_float<200U,_int,_void> local_2e8;
  cpp_dec_float<200U,_int,_void> local_268;
  cpp_dec_float<200U,_int,_void> local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  int *local_160;
  cpp_dec_float<200U,_int,_void> local_158;
  double local_d8;
  undefined8 uStack_d0;
  undefined4 local_c8;
  uint uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar19 = 0;
  local_2e8.fpclass = cpp_dec_float_finite;
  local_2e8.prec_elem = 0x1c;
  local_2e8.data._M_elems[0] = 0;
  local_2e8.data._M_elems[1] = 0;
  local_2e8.data._M_elems[2] = 0;
  local_2e8.data._M_elems[3] = 0;
  local_2e8.data._M_elems[4] = 0;
  local_2e8.data._M_elems[5] = 0;
  local_2e8.data._M_elems[6] = 0;
  local_2e8.data._M_elems[7] = 0;
  local_2e8.data._M_elems[8] = 0;
  local_2e8.data._M_elems[9] = 0;
  local_2e8.data._M_elems[10] = 0;
  local_2e8.data._M_elems[0xb] = 0;
  local_2e8.data._M_elems[0xc] = 0;
  local_2e8.data._M_elems[0xd] = 0;
  local_2e8.data._M_elems[0xe] = 0;
  local_2e8.data._M_elems[0xf] = 0;
  local_2e8.data._M_elems[0x10] = 0;
  local_2e8.data._M_elems[0x11] = 0;
  local_2e8.data._M_elems[0x12] = 0;
  local_2e8.data._M_elems[0x13] = 0;
  local_2e8.data._M_elems[0x14] = 0;
  local_2e8.data._M_elems[0x15] = 0;
  local_2e8.data._M_elems[0x16] = 0;
  local_2e8.data._M_elems[0x17] = 0;
  local_2e8.data._M_elems[0x18] = 0;
  local_2e8.data._M_elems[0x19] = 0;
  local_2e8.data._M_elems._104_5_ = 0;
  local_2e8.data._M_elems[0x1b]._1_3_ = 0;
  local_2e8.exp = 0;
  local_2e8.neg = false;
  local_158.fpclass = cpp_dec_float_finite;
  local_158.prec_elem = 0x1c;
  local_158.data._M_elems[0] = 0;
  local_158.data._M_elems[1] = 0;
  local_158.data._M_elems[2] = 0;
  local_158.data._M_elems[3] = 0;
  local_158.data._M_elems[4] = 0;
  local_158.data._M_elems[5] = 0;
  local_158.data._M_elems[6] = 0;
  local_158.data._M_elems[7] = 0;
  local_158.data._M_elems[8] = 0;
  local_158.data._M_elems[9] = 0;
  local_158.data._M_elems[10] = 0;
  local_158.data._M_elems[0xb] = 0;
  local_158.data._M_elems[0xc] = 0;
  local_158.data._M_elems[0xd] = 0;
  local_158.data._M_elems[0xe] = 0;
  local_158.data._M_elems[0xf] = 0;
  local_158.data._M_elems[0x10] = 0;
  local_158.data._M_elems[0x11] = 0;
  local_158.data._M_elems[0x12] = 0;
  local_158.data._M_elems[0x13] = 0;
  local_158.data._M_elems[0x14] = 0;
  local_158.data._M_elems[0x15] = 0;
  local_158.data._M_elems[0x16] = 0;
  local_158.data._M_elems[0x17] = 0;
  local_158.data._M_elems[0x18] = 0;
  local_158.data._M_elems[0x19] = 0;
  local_158.data._M_elems._104_5_ = 0;
  local_158.data._M_elems[0x1b]._1_3_ = 0;
  local_158.exp = 0;
  local_158.neg = false;
  local_268.fpclass = cpp_dec_float_finite;
  local_268.prec_elem = 0x1c;
  local_268.data._M_elems[0] = 0;
  local_268.data._M_elems[1] = 0;
  local_268.data._M_elems[2] = 0;
  local_268.data._M_elems[3] = 0;
  local_268.data._M_elems[4] = 0;
  local_268.data._M_elems[5] = 0;
  local_268.data._M_elems[6] = 0;
  local_268.data._M_elems[7] = 0;
  local_268.data._M_elems[8] = 0;
  local_268.data._M_elems[9] = 0;
  local_268.data._M_elems[10] = 0;
  local_268.data._M_elems[0xb] = 0;
  local_268.data._M_elems[0xc] = 0;
  local_268.data._M_elems[0xd] = 0;
  local_268.data._M_elems[0xe] = 0;
  local_268.data._M_elems[0xf] = 0;
  local_268.data._M_elems[0x10] = 0;
  local_268.data._M_elems[0x11] = 0;
  local_268.data._M_elems[0x12] = 0;
  local_268.data._M_elems[0x13] = 0;
  local_268.data._M_elems[0x14] = 0;
  local_268.data._M_elems[0x15] = 0;
  local_268.data._M_elems[0x16] = 0;
  local_268.data._M_elems[0x17] = 0;
  local_268.data._M_elems[0x18] = 0;
  local_268.data._M_elems[0x19] = 0;
  local_268.data._M_elems._104_5_ = 0;
  local_268.data._M_elems[0x1b]._1_3_ = 0;
  local_268.exp = 0;
  local_268.neg = false;
  this_00 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_160 = idx;
  a = Tolerances::epsilon(this_00);
  local_b8.fpclass = cpp_dec_float_finite;
  local_b8.prec_elem = 0x1c;
  local_b8.data._M_elems[0] = 0;
  local_b8.data._M_elems[1] = 0;
  local_b8.data._M_elems[2] = 0;
  local_b8.data._M_elems[3] = 0;
  local_b8.data._M_elems[4] = 0;
  local_b8.data._M_elems[5] = 0;
  local_b8.data._M_elems[6] = 0;
  local_b8.data._M_elems[7] = 0;
  local_b8.data._M_elems[8] = 0;
  local_b8.data._M_elems[9] = 0;
  local_b8.data._M_elems[10] = 0;
  local_b8.data._M_elems[0xb] = 0;
  local_b8.data._M_elems[0xc] = 0;
  local_b8.data._M_elems[0xd] = 0;
  local_b8.data._M_elems[0xe] = 0;
  local_b8.data._M_elems[0xf] = 0;
  local_b8.data._M_elems[0x10] = 0;
  local_b8.data._M_elems[0x11] = 0;
  local_b8.data._M_elems[0x12] = 0;
  local_b8.data._M_elems[0x13] = 0;
  local_b8.data._M_elems[0x14] = 0;
  local_b8.data._M_elems[0x15] = 0;
  local_b8.data._M_elems[0x16] = 0;
  local_b8.data._M_elems[0x17] = 0;
  local_b8.data._M_elems[0x18] = 0;
  local_b8.data._M_elems[0x19] = 0;
  local_b8.data._M_elems._104_5_ = 0;
  local_b8.data._M_elems[0x1b]._1_3_ = 0;
  local_b8.exp = 0;
  local_b8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_b8,a);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  pnVar9 = val;
  pcVar12 = &local_158;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pcVar12->data)._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
    pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar9 + ((ulong)bVar19 * -2 + 1) * 4);
    pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar19 * -2 + 1) * 4);
  }
  local_158.exp = (val->m_backend).exp;
  local_158.neg = (val->m_backend).neg;
  local_158.fpclass = (val->m_backend).fpclass;
  local_158.prec_elem = (val->m_backend).prec_elem;
  local_168 = val;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&local_268,0);
  if (num != 0) {
    pnVar9 = &(this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).delta;
    local_d8 = *(double *)(in_FS_OFFSET + -8);
    uStack_d0 = 0;
    local_c8 = SUB84(local_d8,0);
    uStack_c4 = (uint)((ulong)local_d8 >> 0x20) ^ 0x80000000;
    uStack_c0 = 0;
    uStack_bc = 0x80000000;
    lVar6 = (long)num;
    do {
      puVar14 = local_268.data._M_elems + 1;
      iVar5 = local_160[lVar6 + -1];
      pnVar10 = upd + iVar5;
      pcVar12 = &local_2e8;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pcVar12->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
        pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar10 + ((ulong)bVar19 * -2 + 1) * 4);
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar19 * -8 + 4);
      }
      local_2e8.exp = upd[iVar5].m_backend.exp;
      local_2e8.neg = upd[iVar5].m_backend.neg;
      fVar1 = upd[iVar5].m_backend.fpclass;
      iVar2 = upd[iVar5].m_backend.prec_elem;
      local_2e8.fpclass = fVar1;
      local_2e8.prec_elem = iVar2;
      fVar4 = local_b8.fpclass;
      if (local_b8.fpclass == cpp_dec_float_NaN || fVar1 == cpp_dec_float_NaN) {
LAB_005b6bd1:
        pcVar12 = &local_b8;
        pcVar13 = &local_3e8;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pcVar13->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar19 * -8 + 4);
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar19 * -8 + 4);
        }
        local_3e8.exp = local_b8.exp;
        local_3e8.neg = local_b8.neg;
        local_3e8.prec_elem = local_b8.prec_elem;
        local_3e8.fpclass = fVar4;
        if (local_3e8.data._M_elems[0] != 0 || fVar4 != cpp_dec_float_finite) {
          local_3e8.neg = (bool)(local_b8.neg ^ 1);
        }
        if (((fVar4 != cpp_dec_float_NaN) && (local_2e8.fpclass != cpp_dec_float_NaN)) &&
           (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_2e8,&local_3e8), iVar3 < 0)) {
          pcVar12 = &local_2e8;
          pcVar13 = &local_3e8;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pcVar13->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar19 * -8 + 4);
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar19 * -8 + 4);
          }
          local_3e8.exp = local_2e8.exp;
          local_3e8.neg = local_2e8.neg;
          local_3e8.fpclass = local_2e8.fpclass;
          local_3e8.prec_elem = local_2e8.prec_elem;
          if (local_3e8.data._M_elems[0] != 0 || local_2e8.fpclass != cpp_dec_float_finite) {
            local_3e8.neg = (bool)(local_2e8.neg ^ 1);
          }
          if (local_268.fpclass == cpp_dec_float_NaN || local_2e8.fpclass == cpp_dec_float_NaN) {
LAB_005b708d:
            puVar11 = puVar14;
            pcVar12 = &local_1e8;
            for (lVar7 = 0x1b; lVar7 != 0; lVar7 = lVar7 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar11;
              puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar19 * -8 + 4);
            }
            bVar16 = local_268.neg;
            fVar4 = local_268.fpclass;
            iVar3 = local_268.exp;
            iVar17 = local_268.prec_elem;
            uVar18 = local_268.data._M_elems[0];
          }
          else {
            iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_3e8,&local_268);
            if (iVar3 < 1) {
              goto LAB_005b708d;
            }
            puVar11 = local_2e8.data._M_elems + 1;
            pcVar12 = &local_1e8;
            for (lVar7 = 0x1b; lVar7 != 0; lVar7 = lVar7 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar11;
              puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar19 * -8 + 4);
            }
            iVar3 = local_2e8.exp;
            iVar17 = local_2e8.prec_elem;
            if (local_2e8.fpclass == cpp_dec_float_finite && local_2e8.data._M_elems[0] == 0) {
              fVar4 = cpp_dec_float_finite;
              bVar16 = local_2e8.neg;
              uVar18 = 0;
            }
            else {
              bVar16 = local_2e8.neg ^ 1;
              fVar4 = local_2e8.fpclass;
              uVar18 = local_2e8.data._M_elems[0];
            }
          }
          local_268.data._M_elems[0] = uVar18;
          pcVar12 = &local_1e8;
          for (lVar7 = 0x1b; lVar7 != 0; lVar7 = lVar7 + -1) {
            *puVar14 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar19 * -8 + 4);
            puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
          }
          local_268.prec_elem = iVar17;
          local_268.fpclass = fVar4;
          pcVar12 = &up[iVar5].m_backend;
          local_368.fpclass = cpp_dec_float_finite;
          local_368.prec_elem = 0x1c;
          local_368.data._M_elems[0] = 0;
          local_368.data._M_elems[1] = 0;
          local_368.data._M_elems[2] = 0;
          local_368.data._M_elems[3] = 0;
          local_368.data._M_elems[4] = 0;
          local_368.data._M_elems[5] = 0;
          local_368.data._M_elems[6] = 0;
          local_368.data._M_elems[7] = 0;
          local_368.data._M_elems[8] = 0;
          local_368.data._M_elems[9] = 0;
          local_368.data._M_elems[10] = 0;
          local_368.data._M_elems[0xb] = 0;
          local_368.data._M_elems[0xc] = 0;
          local_368.data._M_elems[0xd] = 0;
          local_368.data._M_elems[0xe] = 0;
          local_368.data._M_elems[0xf] = 0;
          local_368.data._M_elems[0x10] = 0;
          local_368.data._M_elems[0x11] = 0;
          local_368.data._M_elems[0x12] = 0;
          local_368.data._M_elems[0x13] = 0;
          local_368.data._M_elems[0x14] = 0;
          local_368.data._M_elems[0x15] = 0;
          local_368.data._M_elems[0x16] = 0;
          local_368.data._M_elems[0x17] = 0;
          local_368.data._M_elems[0x18] = 0;
          local_368.data._M_elems[0x19] = 0;
          local_368.data._M_elems._104_5_ = 0;
          local_368.data._M_elems[0x1b]._1_3_ = 0;
          local_368.exp = 0;
          local_368.neg = false;
          local_268.exp = iVar3;
          local_268.neg = (bool)bVar16;
          if (&local_368 == &vec[iVar5].m_backend) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_368,pcVar12);
            if (local_368.data._M_elems[0] != 0 || local_368.fpclass != cpp_dec_float_finite) {
              local_368.neg = (bool)(local_368.neg ^ 1);
            }
          }
          else {
            if (&local_368 != pcVar12) {
              pcVar13 = pcVar12;
              pcVar15 = &local_368;
              for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
                (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
                pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar19 * -8 + 4)
                ;
                pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar19 * -8 + 4)
                ;
              }
              local_368.exp = pcVar12->exp;
              local_368.neg = pcVar12->neg;
              local_368.fpclass = pcVar12->fpclass;
              local_368.prec_elem = pcVar12->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_368,&vec[iVar5].m_backend);
          }
          local_1e8.fpclass = cpp_dec_float_finite;
          local_1e8.prec_elem = 0x1c;
          local_1e8.data._M_elems[0] = 0;
          local_1e8.data._M_elems[1] = 0;
          local_1e8.data._M_elems[2] = 0;
          local_1e8.data._M_elems[3] = 0;
          local_1e8.data._M_elems[4] = 0;
          local_1e8.data._M_elems[5] = 0;
          local_1e8.data._M_elems[6] = 0;
          local_1e8.data._M_elems[7] = 0;
          local_1e8.data._M_elems[8] = 0;
          local_1e8.data._M_elems[9] = 0;
          local_1e8.data._M_elems[10] = 0;
          local_1e8.data._M_elems[0xb] = 0;
          local_1e8.data._M_elems[0xc] = 0;
          local_1e8.data._M_elems[0xd] = 0;
          local_1e8.data._M_elems[0xe] = 0;
          local_1e8.data._M_elems[0xf] = 0;
          local_1e8.data._M_elems[0x10] = 0;
          local_1e8.data._M_elems[0x11] = 0;
          local_1e8.data._M_elems[0x12] = 0;
          local_1e8.data._M_elems[0x13] = 0;
          local_1e8.data._M_elems[0x14] = 0;
          local_1e8.data._M_elems[0x15] = 0;
          local_1e8.data._M_elems[0x16] = 0;
          local_1e8.data._M_elems[0x17] = 0;
          local_1e8.data._M_elems[0x18] = 0;
          local_1e8.data._M_elems[0x19] = 0;
          local_1e8.data._M_elems._104_5_ = 0;
          local_1e8.data._M_elems[0x1b]._1_3_ = 0;
          local_1e8.exp = 0;
          local_1e8.neg = false;
          pcVar13 = &local_368;
          if (&local_1e8 != &pnVar9->m_backend) {
            pcVar15 = &local_1e8;
            for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
              (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar19 * -8 + 4);
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar19 * -8 + 4);
            }
            local_1e8.exp = local_368.exp;
            local_1e8.neg = local_368.neg;
            local_1e8.fpclass = local_368.fpclass;
            local_1e8.prec_elem = local_368.prec_elem;
            pcVar13 = &pnVar9->m_backend;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&local_1e8,pcVar13);
          local_3e8.fpclass = cpp_dec_float_finite;
          local_3e8.prec_elem = 0x1c;
          local_3e8.data._M_elems[0] = 0;
          local_3e8.data._M_elems[1] = 0;
          local_3e8.data._M_elems[2] = 0;
          local_3e8.data._M_elems[3] = 0;
          local_3e8.data._M_elems[4] = 0;
          local_3e8.data._M_elems[5] = 0;
          local_3e8.data._M_elems[6] = 0;
          local_3e8.data._M_elems[7] = 0;
          local_3e8.data._M_elems[8] = 0;
          local_3e8.data._M_elems[9] = 0;
          local_3e8.data._M_elems[10] = 0;
          local_3e8.data._M_elems[0xb] = 0;
          local_3e8.data._M_elems[0xc] = 0;
          local_3e8.data._M_elems[0xd] = 0;
          local_3e8.data._M_elems[0xe] = 0;
          local_3e8.data._M_elems[0xf] = 0;
          local_3e8.data._M_elems[0x10] = 0;
          local_3e8.data._M_elems[0x11] = 0;
          local_3e8.data._M_elems[0x12] = 0;
          local_3e8.data._M_elems[0x13] = 0;
          local_3e8.data._M_elems[0x14] = 0;
          local_3e8.data._M_elems[0x15] = 0;
          local_3e8.data._M_elems[0x16] = 0;
          local_3e8.data._M_elems[0x17] = 0;
          local_3e8.data._M_elems[0x18] = 0;
          local_3e8.data._M_elems[0x19] = 0;
          local_3e8.data._M_elems._104_5_ = 0;
          local_3e8.data._M_elems[0x1b]._1_3_ = 0;
          local_3e8.exp = 0;
          local_3e8.neg = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_3e8,&local_1e8,&local_2e8);
          pcVar13 = &local_3e8;
          pcVar15 = &local_2e8;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar19 * -8 + 4);
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar19 * -8 + 4);
          }
          local_2e8.exp = local_3e8.exp;
          local_2e8.neg = local_3e8.neg;
          local_2e8.fpclass = local_3e8.fpclass;
          local_2e8.prec_elem = local_3e8.prec_elem;
          if (((local_3e8.fpclass != cpp_dec_float_NaN) && (local_158.fpclass != cpp_dec_float_NaN))
             && (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_2e8,&local_158), 0 < iVar5)) {
            ::soplex::infinity::__tls_init();
            local_3e8.fpclass = cpp_dec_float_finite;
            local_3e8.prec_elem = 0x1c;
            local_3e8.data._M_elems[0] = 0;
            local_3e8.data._M_elems[1] = 0;
            local_3e8.data._M_elems[2] = 0;
            local_3e8.data._M_elems[3] = 0;
            local_3e8.data._M_elems[4] = 0;
            local_3e8.data._M_elems[5] = 0;
            local_3e8.data._M_elems[6] = 0;
            local_3e8.data._M_elems[7] = 0;
            local_3e8.data._M_elems[8] = 0;
            local_3e8.data._M_elems[9] = 0;
            local_3e8.data._M_elems[10] = 0;
            local_3e8.data._M_elems[0xb] = 0;
            local_3e8.data._M_elems[0xc] = 0;
            local_3e8.data._M_elems[0xd] = 0;
            local_3e8.data._M_elems[0xe] = 0;
            local_3e8.data._M_elems[0xf] = 0;
            local_3e8.data._M_elems[0x10] = 0;
            local_3e8.data._M_elems[0x11] = 0;
            local_3e8.data._M_elems[0x12] = 0;
            local_3e8.data._M_elems[0x13] = 0;
            local_3e8.data._M_elems[0x14] = 0;
            local_3e8.data._M_elems[0x15] = 0;
            local_3e8.data._M_elems[0x16] = 0;
            local_3e8.data._M_elems[0x17] = 0;
            local_3e8.data._M_elems[0x18] = 0;
            local_3e8.data._M_elems[0x19] = 0;
            local_3e8.data._M_elems._104_5_ = 0;
            local_3e8.data._M_elems[0x1b]._1_3_ = 0;
            local_3e8.exp = 0;
            local_3e8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_3e8,local_d8);
            if (((pcVar12->fpclass != cpp_dec_float_NaN) && (local_3e8.fpclass != cpp_dec_float_NaN)
                ) && (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              compare(pcVar12,&local_3e8), iVar5 < 0)) goto LAB_005b7043;
          }
        }
      }
      else {
        iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_2e8,&local_b8);
        if (iVar3 < 1) {
          fVar4 = local_b8.fpclass;
          goto LAB_005b6bd1;
        }
        piVar8 = &local_268.prec_elem;
        fVar4 = local_268.fpclass;
        if (local_268.fpclass != cpp_dec_float_NaN && local_2e8.fpclass != cpp_dec_float_NaN) {
          iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_2e8,&local_268);
          if (iVar3 < 1) {
            piVar8 = &local_268.prec_elem;
            fVar4 = local_268.fpclass;
          }
          else {
            pcVar12 = &local_2e8;
            pcVar13 = &local_268;
            for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
              (pcVar13->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar19 * -8 + 4);
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar19 * -8 + 4);
            }
            local_268.exp = local_2e8.exp;
            local_268.neg = local_2e8.neg;
            piVar8 = &local_2e8.prec_elem;
            fVar4 = local_2e8.fpclass;
          }
        }
        local_268.fpclass = fVar4;
        local_268.prec_elem = *piVar8;
        pcVar12 = &low[iVar5].m_backend;
        local_368.fpclass = cpp_dec_float_finite;
        local_368.prec_elem = 0x1c;
        local_368.data._M_elems[0] = 0;
        local_368.data._M_elems[1] = 0;
        local_368.data._M_elems[2] = 0;
        local_368.data._M_elems[3] = 0;
        local_368.data._M_elems[4] = 0;
        local_368.data._M_elems[5] = 0;
        local_368.data._M_elems[6] = 0;
        local_368.data._M_elems[7] = 0;
        local_368.data._M_elems[8] = 0;
        local_368.data._M_elems[9] = 0;
        local_368.data._M_elems[10] = 0;
        local_368.data._M_elems[0xb] = 0;
        local_368.data._M_elems[0xc] = 0;
        local_368.data._M_elems[0xd] = 0;
        local_368.data._M_elems[0xe] = 0;
        local_368.data._M_elems[0xf] = 0;
        local_368.data._M_elems[0x10] = 0;
        local_368.data._M_elems[0x11] = 0;
        local_368.data._M_elems[0x12] = 0;
        local_368.data._M_elems[0x13] = 0;
        local_368.data._M_elems[0x14] = 0;
        local_368.data._M_elems[0x15] = 0;
        local_368.data._M_elems[0x16] = 0;
        local_368.data._M_elems[0x17] = 0;
        local_368.data._M_elems[0x18] = 0;
        local_368.data._M_elems[0x19] = 0;
        local_368.data._M_elems._104_5_ = 0;
        local_368.data._M_elems[0x1b]._1_3_ = 0;
        local_368.exp = 0;
        local_368.neg = false;
        if (&local_368 == &vec[iVar5].m_backend) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_368,pcVar12);
          if (local_368.data._M_elems[0] != 0 || local_368.fpclass != cpp_dec_float_finite) {
            local_368.neg = (bool)(local_368.neg ^ 1);
          }
        }
        else {
          if (&local_368 != pcVar12) {
            pcVar13 = pcVar12;
            pcVar15 = &local_368;
            for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
              (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar19 * -8 + 4);
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar19 * -8 + 4);
            }
            local_368.exp = pcVar12->exp;
            local_368.neg = pcVar12->neg;
            local_368.fpclass = pcVar12->fpclass;
            local_368.prec_elem = pcVar12->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_368,&vec[iVar5].m_backend);
        }
        local_1e8.fpclass = cpp_dec_float_finite;
        local_1e8.prec_elem = 0x1c;
        local_1e8.data._M_elems[0] = 0;
        local_1e8.data._M_elems[1] = 0;
        local_1e8.data._M_elems[2] = 0;
        local_1e8.data._M_elems[3] = 0;
        local_1e8.data._M_elems[4] = 0;
        local_1e8.data._M_elems[5] = 0;
        local_1e8.data._M_elems[6] = 0;
        local_1e8.data._M_elems[7] = 0;
        local_1e8.data._M_elems[8] = 0;
        local_1e8.data._M_elems[9] = 0;
        local_1e8.data._M_elems[10] = 0;
        local_1e8.data._M_elems[0xb] = 0;
        local_1e8.data._M_elems[0xc] = 0;
        local_1e8.data._M_elems[0xd] = 0;
        local_1e8.data._M_elems[0xe] = 0;
        local_1e8.data._M_elems[0xf] = 0;
        local_1e8.data._M_elems[0x10] = 0;
        local_1e8.data._M_elems[0x11] = 0;
        local_1e8.data._M_elems[0x12] = 0;
        local_1e8.data._M_elems[0x13] = 0;
        local_1e8.data._M_elems[0x14] = 0;
        local_1e8.data._M_elems[0x15] = 0;
        local_1e8.data._M_elems[0x16] = 0;
        local_1e8.data._M_elems[0x17] = 0;
        local_1e8.data._M_elems[0x18] = 0;
        local_1e8.data._M_elems[0x19] = 0;
        local_1e8.data._M_elems._104_5_ = 0;
        local_1e8.data._M_elems[0x1b]._1_3_ = 0;
        local_1e8.exp = 0;
        local_1e8.neg = false;
        if (&local_1e8 == &pnVar9->m_backend) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_1e8,&local_368);
          if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite) {
            local_1e8.neg = (bool)(local_1e8.neg ^ 1);
          }
        }
        else {
          pcVar13 = &local_368;
          pcVar15 = &local_1e8;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar19 * -8 + 4);
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar19 * -8 + 4);
          }
          local_1e8.exp = local_368.exp;
          local_1e8.neg = local_368.neg;
          local_1e8.fpclass = local_368.fpclass;
          local_1e8.prec_elem = local_368.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_1e8,&pnVar9->m_backend);
        }
        local_3e8.fpclass = cpp_dec_float_finite;
        local_3e8.prec_elem = 0x1c;
        local_3e8.data._M_elems[0] = 0;
        local_3e8.data._M_elems[1] = 0;
        local_3e8.data._M_elems[2] = 0;
        local_3e8.data._M_elems[3] = 0;
        local_3e8.data._M_elems[4] = 0;
        local_3e8.data._M_elems[5] = 0;
        local_3e8.data._M_elems[6] = 0;
        local_3e8.data._M_elems[7] = 0;
        local_3e8.data._M_elems[8] = 0;
        local_3e8.data._M_elems[9] = 0;
        local_3e8.data._M_elems[10] = 0;
        local_3e8.data._M_elems[0xb] = 0;
        local_3e8.data._M_elems[0xc] = 0;
        local_3e8.data._M_elems[0xd] = 0;
        local_3e8.data._M_elems[0xe] = 0;
        local_3e8.data._M_elems[0xf] = 0;
        local_3e8.data._M_elems[0x10] = 0;
        local_3e8.data._M_elems[0x11] = 0;
        local_3e8.data._M_elems[0x12] = 0;
        local_3e8.data._M_elems[0x13] = 0;
        local_3e8.data._M_elems[0x14] = 0;
        local_3e8.data._M_elems[0x15] = 0;
        local_3e8.data._M_elems[0x16] = 0;
        local_3e8.data._M_elems[0x17] = 0;
        local_3e8.data._M_elems[0x18] = 0;
        local_3e8.data._M_elems[0x19] = 0;
        local_3e8.data._M_elems._104_5_ = 0;
        local_3e8.data._M_elems[0x1b]._1_3_ = 0;
        local_3e8.exp = 0;
        local_3e8.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_3e8,&local_1e8,&local_2e8);
        pcVar13 = &local_3e8;
        pcVar15 = &local_2e8;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar19 * -8 + 4);
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar19 * -8 + 4);
        }
        local_2e8.exp = local_3e8.exp;
        local_2e8.neg = local_3e8.neg;
        local_2e8.fpclass = local_3e8.fpclass;
        local_2e8.prec_elem = local_3e8.prec_elem;
        if (((local_3e8.fpclass == cpp_dec_float_NaN) || (local_158.fpclass == cpp_dec_float_NaN))
           || (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_2e8,&local_158), iVar5 < 1)) goto LAB_005b73e3;
        ::soplex::infinity::__tls_init();
        local_3e8.fpclass = cpp_dec_float_finite;
        local_3e8.prec_elem = 0x1c;
        local_3e8.data._M_elems[0] = 0;
        local_3e8.data._M_elems[1] = 0;
        local_3e8.data._M_elems[2] = 0;
        local_3e8.data._M_elems[3] = 0;
        local_3e8.data._M_elems[4] = 0;
        local_3e8.data._M_elems[5] = 0;
        local_3e8.data._M_elems[6] = 0;
        local_3e8.data._M_elems[7] = 0;
        local_3e8.data._M_elems[8] = 0;
        local_3e8.data._M_elems[9] = 0;
        local_3e8.data._M_elems[10] = 0;
        local_3e8.data._M_elems[0xb] = 0;
        local_3e8.data._M_elems[0xc] = 0;
        local_3e8.data._M_elems[0xd] = 0;
        local_3e8.data._M_elems[0xe] = 0;
        local_3e8.data._M_elems[0xf] = 0;
        local_3e8.data._M_elems[0x10] = 0;
        local_3e8.data._M_elems[0x11] = 0;
        local_3e8.data._M_elems[0x12] = 0;
        local_3e8.data._M_elems[0x13] = 0;
        local_3e8.data._M_elems[0x14] = 0;
        local_3e8.data._M_elems[0x15] = 0;
        local_3e8.data._M_elems[0x16] = 0;
        local_3e8.data._M_elems[0x17] = 0;
        local_3e8.data._M_elems[0x18] = 0;
        local_3e8.data._M_elems[0x19] = 0;
        local_3e8.data._M_elems._104_5_ = 0;
        local_3e8.data._M_elems[0x1b]._1_3_ = 0;
        local_3e8.exp = 0;
        local_3e8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_3e8,(double)CONCAT44(uStack_c4,local_c8));
        if (((pcVar12->fpclass == cpp_dec_float_NaN) || (local_3e8.fpclass == cpp_dec_float_NaN)) ||
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (pcVar12,&local_3e8), iVar5 < 1)) goto LAB_005b73e3;
LAB_005b7043:
        pcVar12 = &local_2e8;
        pcVar13 = &local_158;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pcVar13->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar19 * -8 + 4);
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar19 * -8 + 4);
        }
        local_158.exp = local_2e8.exp;
        local_158.neg = local_2e8.neg;
        local_158.fpclass = local_2e8.fpclass;
        local_158.prec_elem = local_2e8.prec_elem;
      }
LAB_005b73e3:
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  pcVar12 = &local_158;
  pnVar9 = local_168;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pnVar9->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
    pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar19 * -2 + 1) * 4);
    pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar9 + ((ulong)bVar19 * -2 + 1) * 4);
  }
  (local_168->m_backend).exp = local_158.exp;
  (local_168->m_backend).neg = local_158.neg;
  (local_168->m_backend).fpclass = local_158.fpclass;
  (local_168->m_backend).prec_elem = local_158.prec_elem;
  return -1;
}

Assistant:

int SPxHarrisRT<R>::minDelta(
   R* /*max*/,             /* max abs value in upd */
   R* val,             /* initial and chosen value */
   int num,             /* # of indices in idx */
   const int* idx,             /* nonzero indices in upd */
   const R* upd,             /* update VectorBase<R> for vec */
   const R* vec,             /* current VectorBase<R> */
   const R* low,             /* lower bounds for vec */
   const R* up               /* upper bounds for vec */
) const
{
   R x;
   R theval;
   /**@todo patch suggests using *max instead of themax */
   R themax;
   int sel;
   int i;
   R epsilon = this->tolerances()->epsilon();

   assert(*val < 0);

   theval = *val;
   themax = 0;
   sel = -1;

   while(num--)
   {
      i = idx[num];
      x = upd[i];

      if(x > epsilon)
      {
         themax = (x > themax) ? x : themax;
         x = (low[i] - vec[i] - this->delta) / x;

         if(x > theval && low[i] > R(-infinity))
            theval = x;
      }
      else if(x < -epsilon)
      {
         themax = (-x > themax) ? -x : themax;
         x = (up[i] - vec[i] + this->delta) / x;

         if(x > theval && up[i] < R(infinity))
            theval = x;
      }
   }

   *val = theval;
   return sel;
}